

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::capture_default_str(Option *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Option *local_10;
  Option *this_local;
  
  local_10 = this;
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->default_function_);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_30,&this->default_function_);
    ::std::__cxx11::string::operator=((string *)&this->default_str_,(string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

Option *capture_default_str() {
        if(default_function_) {
            default_str_ = default_function_();
        }
        return this;
    }